

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall RPCCommandExecution::~RPCCommandExecution(RPCCommandExecution *this)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = (mutex_type *)&g_rpc_server_info;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  std::__cxx11::list<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_>::_M_erase
            (&g_rpc_server_info.active_commands,(this->it)._M_node);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~RPCCommandExecution()
    {
        LOCK(g_rpc_server_info.mutex);
        g_rpc_server_info.active_commands.erase(it);
    }